

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
hta::detail::make_exception<const_char_*,_unsigned_long,_const_char_*,_unsigned_long>::operator()
          (make_exception<const_char_*,_unsigned_long,_const_char_*,_unsigned_long> *this,
          stringstream *msg,char *arg,unsigned_long args,char *args_1,unsigned_long args_2)

{
  ostream *poVar1;
  size_t sVar2;
  make_exception<const_char_*,_unsigned_long> local_31;
  
  poVar1 = (ostream *)(msg + 0x10);
  if (arg == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar1 + -0x18) + (int)poVar1);
  }
  else {
    sVar2 = strlen(arg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,arg,sVar2);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  make_exception<const_char_*,_unsigned_long>::operator()(&local_31,msg,args_1,args_2);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }